

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_> parseProject(Output *output,char *file)

{
  byte bVar1;
  char *in_RDX;
  long *in_RSI;
  __uniq_ptr_data<ProjectGroup,_std::default_delete<ProjectGroup>,_true,_true> in_RDI;
  exception *e;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>_>_>
  regexCache;
  uint line;
  string pathBase;
  ifstream in;
  unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_> *in_stack_fffffffffffffcb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb8;
  char *in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcd8;
  allocator local_2b1;
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  undefined4 local_230;
  long local_220 [29];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>_>_>
  *in_stack_fffffffffffffec8;
  ProjectGroup *in_stack_fffffffffffffed0;
  uint *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  ifstream *in_stack_fffffffffffffee8;
  char *in_stack_ffffffffffffff00;
  
  std::ifstream::ifstream(local_220,in_RDX,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    getCurrentDirectory_abi_cxx11_();
    std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b0,in_RDX,&local_2b1);
    std::operator+(in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0);
    std::__cxx11::string::c_str();
    normalizePath_abi_cxx11_(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    std::__cxx11::string::~string(local_290);
    std::__cxx11::string::~string(local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    std::__cxx11::string::~string(local_270);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>_>_>
           *)0x145b8f);
    std::__cxx11::string::c_str();
    parseGroup(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_ffffffffffffff00);
    local_230 = 1;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>_>_>
            *)0x145d54);
    std::__cxx11::string::~string(local_250);
  }
  else {
    (**(code **)(*in_RSI + 0x20))(in_RSI,"Error reading file %s\n",in_RDX);
    std::unique_ptr<ProjectGroup,std::default_delete<ProjectGroup>>::
    unique_ptr<std::default_delete<ProjectGroup>,void>(in_stack_fffffffffffffcb0);
    local_230 = 1;
  }
  std::ifstream::~ifstream(local_220);
  return (__uniq_ptr_data<ProjectGroup,_std::default_delete<ProjectGroup>,_true,_true>)
         (tuple<ProjectGroup_*,_std::default_delete<ProjectGroup>_>)
         in_RDI.super___uniq_ptr_impl<ProjectGroup,_std::default_delete<ProjectGroup>_>._M_t.
         super__Tuple_impl<0UL,_ProjectGroup_*,_std::default_delete<ProjectGroup>_>.
         super__Head_base<0UL,_ProjectGroup_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<ProjectGroup> parseProject(Output* output, const char* file)
{
	std::ifstream in(file);
	if (!in)
	{
		output->error("Error reading file %s\n", file);
		return std::unique_ptr<ProjectGroup>();
	}

	// treat all project paths as project file-relative; treat project file path as current directory-relative
	std::string pathBase = normalizePath(getCurrentDirectory().c_str(), (std::string(file) + "/..").c_str());

	unsigned int line = 0;
	std::map<std::string, std::shared_ptr<Regex>> regexCache;

	try
	{
		return parseGroup(in, file, line, 0, regexCache, pathBase.c_str());
	}
	catch (const std::exception& e)
	{
		output->error("%s(%d): %s\n", file, line, e.what());
		return std::unique_ptr<ProjectGroup>();
	}
}